

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O0

bool ClientUtils::IsValidMulticastIP(string *i_MulticastIPAddress)

{
  impl_type *host;
  bool bVar1;
  basic_resolver_entry<boost::asio::ip::tcp> *this;
  unsigned_long uVar2;
  bool local_229;
  address_v4 local_1f4;
  address local_1f0;
  undefined1 local_1cc [40];
  undefined1 local_1a4 [8];
  endpoint EndPoint;
  undefined1 local_178 [8];
  iterator End;
  undefined1 local_148 [8];
  iterator It;
  string local_128;
  undefined1 local_108 [8];
  query Query;
  resolver Resolver;
  address_v4 local_3c;
  undefined1 auStack_38 [4];
  address_v4 Address;
  error_code Error;
  undefined1 local_20 [8];
  io_service Service;
  string *i_MulticastIPAddress_local;
  
  Service.impl_ = (impl_type *)i_MulticastIPAddress;
  boost::asio::io_context::io_context((io_context *)local_20);
  boost::system::error_code::error_code((error_code *)auStack_38);
  boost::asio::ip::address_v4::from_string
            (&local_3c,(string *)Service.impl_,(error_code *)auStack_38);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_38);
  if (bVar1) {
    boost::asio::ip::
    basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::basic_resolver<boost::asio::io_context>
              ((basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)((long)&Query.service_name_.field_2 + 8),(io_context *)local_20,(type *)0x0);
    host = Service.impl_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"",(allocator *)((long)&It.index_ + 7));
    boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
              ((basic_resolver_query<boost::asio::ip::tcp> *)local_108,(string *)host,&local_128,
               address_configured);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&It.index_ + 7));
    boost::asio::ip::
    basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::resolve((results_type *)&End.index_,
              (basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)((long)&Query.service_name_.field_2 + 8),(query *)local_108,
              (error_code *)auStack_38);
    boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
              ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_148,
               (basic_resolver_iterator<boost::asio::ip::tcp> *)&End.index_);
    boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>::~basic_resolver_results
              ((basic_resolver_results<boost::asio::ip::tcp> *)&End.index_);
    boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
              ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_178);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_38);
    if (bVar1) {
      boost::asio::ip::address_v4::address_v4(&local_1f4);
      boost::asio::ip::address_v4::operator=(&local_3c,&local_1f4);
    }
    else {
      while (bVar1 = boost::asio::ip::operator!=
                               ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_148,
                                (basic_resolver_iterator<boost::asio::ip::tcp> *)local_178), bVar1)
      {
        boost::system::error_code::error_code
                  ((error_code *)((long)&EndPoint.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
        auStack_38 = (undefined1  [4])EndPoint.impl_.data_._20_4_;
        Address.addr_.s_addr._0_1_ = (bool)EndPoint.impl_.data_._24_1_;
        Address.addr_.s_addr._1_3_ = EndPoint.impl_.data_._25_3_;
        this = boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::operator*
                         ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_148);
        boost::asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
                  ((endpoint_type *)local_1a4,(basic_resolver_entry *)this);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  ((address *)(local_1cc + 4),(basic_endpoint<boost::asio::ip::tcp> *)local_1a4);
        bVar1 = boost::asio::ip::address::is_v4((address *)(local_1cc + 4));
        if (bVar1) {
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    (&local_1f0,(basic_endpoint<boost::asio::ip::tcp> *)local_1a4);
          boost::asio::ip::address::to_v4((address *)local_1cc);
          boost::asio::ip::address_v4::operator=(&local_3c,(address_v4 *)local_1cc);
          break;
        }
        boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::operator++
                  ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_148);
      }
    }
    boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
              ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_178);
    boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
              ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_148);
    boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query
              ((basic_resolver_query<boost::asio::ip::tcp> *)local_108);
    boost::asio::ip::
    basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~basic_resolver((basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)((long)&Query.service_name_.field_2 + 8));
  }
  bVar1 = boost::asio::ip::address_v4::is_multicast(&local_3c);
  local_229 = true;
  if (!bVar1) {
    uVar2 = boost::asio::ip::address_v4::to_ulong(&local_3c);
    local_229 = uVar2 == 0xffffffff;
  }
  boost::asio::io_context::~io_context((io_context *)local_20);
  return local_229;
}

Assistant:

bool IsValidMulticastIP( const std::string & i_MulticastIPAddress )
  {
    boost::asio::io_service Service;
    boost::system::error_code Error;
    boost::asio::ip::address_v4 Address = boost::asio::ip::address_v4::from_string( i_MulticastIPAddress, Error );
    if( Error )
    {
      boost::asio::ip::tcp::resolver Resolver( Service );
      boost::asio::ip::tcp::resolver::query Query( i_MulticastIPAddress, "" );
      
      boost::asio::ip::tcp::resolver::iterator It = Resolver.resolve( Query, Error );
      boost::asio::ip::tcp::resolver::iterator End;
      
      if( ! Error )
      {
        for( ; It != End; ++It )
        {
          Error = boost::system::error_code();
          boost::asio::ip::tcp::endpoint EndPoint( *It );

          // Currently we only handle IPv4
          if( EndPoint.address().is_v4() )
          {
            Address = EndPoint.address().to_v4();
            break;
          }
        }
      }
      else
      {
        Address = boost::asio::ip::address_v4();
      }
    }

    return( Address.is_multicast() || ( Address.to_ulong() == 0xFFFFFFFF ) );
  }